

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pospopcnt.c
# Opt level: O2

int pospopcnt_u16_sse_harley_seal(uint16_t *array,uint32_t len,uint32_t *flags)

{
  ushort uVar1;
  uint uVar2;
  size_t i_1;
  ulong uVar3;
  size_t i;
  ulong uVar4;
  ulong uVar5;
  int j;
  uint32_t uVar6;
  long lVar7;
  undefined1 (*pauVar8) [16];
  size_t z;
  long lVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [64];
  undefined1 auVar28 [64];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [64];
  undefined1 auVar32 [64];
  undefined1 local_118 [16];
  undefined1 local_108 [16];
  undefined1 local_f8 [16];
  undefined1 local_e8 [16];
  undefined1 local_d8 [16];
  undefined1 local_c8 [16];
  undefined1 local_b8 [16];
  undefined1 local_a8 [16];
  undefined1 local_98 [16];
  undefined1 auStack_88 [8];
  uint16_t buffer [8];
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  undefined1 local_38 [16];
  undefined1 local_28 [16];
  undefined1 local_18 [16];
  
  for (uVar2 = len & 0xffffff80; uVar2 < len; uVar2 = uVar2 + 1) {
    uVar1 = array[uVar2];
    for (lVar7 = 0; lVar7 != 0x10; lVar7 = lVar7 + 1) {
      flags[lVar7] = flags[lVar7] + (uint)((uVar1 >> ((uint)lVar7 & 0x1f) & 1) != 0);
    }
  }
  auVar29._8_2_ = 1;
  auVar29._0_8_ = 0x1000100010001;
  auVar29._10_2_ = 1;
  auVar29._12_2_ = 1;
  auVar29._14_2_ = 1;
  auVar30 = (undefined1  [16])0x0;
  auVar27 = ZEXT1664((undefined1  [16])0x0);
  auVar28 = ZEXT1664((undefined1  [16])0x0);
  auVar31 = ZEXT1664((undefined1  [16])0x0);
  auVar32 = ZEXT1664((undefined1  [16])0x0);
  uVar3 = 0;
  uVar5 = (ulong)(len >> 3 & 0xfffffff0);
  while (uVar3 < uVar5) {
    for (lVar7 = 0; lVar7 != 0x100; lVar7 = lVar7 + 0x10) {
      *(undefined8 *)(local_108 + lVar7) = 0;
      *(undefined8 *)(local_108 + lVar7 + 8) = 0;
    }
    auVar10 = vmovdqa64_avx512vl(local_f8);
    auVar11 = vmovdqa64_avx512vl(local_e8);
    auVar12 = vmovdqa64_avx512vl(local_d8);
    auVar13 = vmovdqa64_avx512vl(local_c8);
    auVar14 = vmovdqa64_avx512vl(local_b8);
    auVar15 = vmovdqa64_avx512vl(local_a8);
    auVar16 = vmovdqa64_avx512vl(local_98);
    uVar4 = uVar3 + 0xffff;
    if (uVar5 - uVar3 < 0x10000) {
      uVar4 = uVar5;
    }
    pauVar8 = (undefined1 (*) [16])(array + uVar3 * 8 + 0x78);
    while (uVar3 < uVar4) {
      auVar17 = vmovdqu64_avx512vl(pauVar8[-0xf]);
      auVar18 = vmovdqu64_avx512vl(pauVar8[-0xe]);
      auVar19 = vmovdqu64_avx512vl(pauVar8[-0xd]);
      auVar20 = vmovdqu64_avx512vl(pauVar8[-0xc]);
      uVar3 = uVar3 + 0x10;
      auVar21 = vpxorq_avx512vl(auVar17,auVar32._0_16_);
      auVar22 = vpandq_avx512vl(auVar21,auVar18);
      auVar17 = vpternlogq_avx512vl(auVar22,auVar17,auVar32._0_16_,0xf8);
      auVar18 = vpxorq_avx512vl(auVar21,auVar18);
      auVar21 = vpxorq_avx512vl(auVar18,auVar19);
      auVar22 = vpandq_avx512vl(auVar21,auVar20);
      auVar18 = vpternlogq_avx512vl(auVar22,auVar18,auVar19,0xf8);
      auVar19 = vpxorq_avx512vl(auVar21,auVar20);
      auVar20 = vpxorq_avx512vl(auVar17,auVar31._0_16_);
      auVar21 = vpandq_avx512vl(auVar18,auVar20);
      auVar17 = vpternlogq_avx512vl(auVar21,auVar17,auVar31._0_16_,0xf8);
      auVar18 = vpxorq_avx512vl(auVar18,auVar20);
      auVar20 = vmovdqu64_avx512vl(pauVar8[-0xb]);
      auVar21 = vmovdqu64_avx512vl(pauVar8[-10]);
      auVar22 = vpxorq_avx512vl(auVar19,auVar20);
      auVar23 = vpandq_avx512vl(auVar22,auVar21);
      auVar19 = vpternlogq_avx512vl(auVar23,auVar19,auVar20,0xf8);
      auVar20 = vmovdqu64_avx512vl(pauVar8[-9]);
      auVar21 = vpxorq_avx512vl(auVar22,auVar21);
      auVar22 = vmovdqu64_avx512vl(pauVar8[-8]);
      auVar23 = vpxorq_avx512vl(auVar21,auVar20);
      auVar24 = vpandq_avx512vl(auVar23,auVar22);
      auVar20 = vpternlogq_avx512vl(auVar24,auVar21,auVar20,0xf8);
      auVar21 = vpxorq_avx512vl(auVar19,auVar18);
      auVar22 = vpxorq_avx512vl(auVar23,auVar22);
      auVar23 = vpxorq_avx512vl(auVar17,auVar28._0_16_);
      auVar24 = vpandq_avx512vl(auVar20,auVar21);
      auVar18 = vpternlogq_avx512vl(auVar24,auVar19,auVar18,0xf8);
      auVar19 = vpxorq_avx512vl(auVar20,auVar21);
      auVar20 = vpandq_avx512vl(auVar18,auVar23);
      auVar17 = vpternlogq_avx512vl(auVar20,auVar17,auVar28._0_16_,0xf8);
      auVar18 = vpxorq_avx512vl(auVar18,auVar23);
      auVar20 = vmovdqu64_avx512vl(pauVar8[-7]);
      auVar21 = vmovdqu64_avx512vl(pauVar8[-6]);
      auVar23 = vpxorq_avx512vl(auVar22,auVar20);
      auVar24 = vpandq_avx512vl(auVar23,auVar21);
      auVar20 = vpternlogq_avx512vl(auVar24,auVar22,auVar20,0xf8);
      auVar22 = vmovdqu64_avx512vl(pauVar8[-5]);
      auVar21 = vpxorq_avx512vl(auVar23,auVar21);
      auVar23 = vmovdqu64_avx512vl(pauVar8[-4]);
      auVar24 = vpxorq_avx512vl(auVar21,auVar22);
      auVar25 = vpandq_avx512vl(auVar24,auVar23);
      auVar21 = vpternlogq_avx512vl(auVar25,auVar21,auVar22,0xf8);
      auVar22 = vpxorq_avx512vl(auVar20,auVar19);
      auVar23 = vpxorq_avx512vl(auVar24,auVar23);
      auVar24 = vmovdqu64_avx512vl(pauVar8[-2]);
      auVar25 = vpandq_avx512vl(auVar21,auVar22);
      auVar19 = vpternlogq_avx512vl(auVar25,auVar20,auVar19,0xf8);
      auVar20 = vpxorq_avx512vl(auVar21,auVar22);
      auVar21 = vmovdqu64_avx512vl(pauVar8[-3]);
      auVar22 = vpxorq_avx512vl(auVar23,auVar21);
      auVar25 = vpandq_avx512vl(auVar22,auVar24);
      auVar21 = vpternlogq_avx512vl(auVar25,auVar23,auVar21,0xf8);
      auVar23 = vmovdqu64_avx512vl(pauVar8[-1]);
      auVar22 = vpxorq_avx512vl(auVar22,auVar24);
      auVar24 = vmovdqu64_avx512vl(*pauVar8);
      pauVar8 = pauVar8 + 0x10;
      auVar25 = vpxorq_avx512vl(auVar22,auVar23);
      auVar26 = vpandq_avx512vl(auVar25,auVar24);
      auVar22 = vpternlogq_avx512vl(auVar26,auVar22,auVar23,0xf8);
      auVar23 = vpxorq_avx512vl(auVar21,auVar20);
      auVar24 = vpxorq_avx512vl(auVar25,auVar24);
      auVar32 = ZEXT1664(auVar24);
      auVar24 = vpandq_avx512vl(auVar22,auVar23);
      auVar20 = vpternlogq_avx512vl(auVar24,auVar21,auVar20,0xf8);
      auVar21 = vpxorq_avx512vl(auVar22,auVar23);
      auVar31 = ZEXT1664(auVar21);
      auVar21 = vpxorq_avx512vl(auVar19,auVar18);
      auVar22 = vpandq_avx512vl(auVar20,auVar21);
      auVar18 = vpternlogq_avx512vl(auVar22,auVar19,auVar18,0xf8);
      auVar19 = vpxorq_avx512vl(auVar20,auVar21);
      auVar28 = ZEXT1664(auVar19);
      auVar19 = vpandq_avx512vl(auVar30,auVar29);
      auVar20 = vpxorq_avx512vl(auVar17,auVar27._0_16_);
      local_108 = vpaddw_avx512vl(local_108,auVar19);
      auVar19 = vpsrlw_avx512vl(auVar30,1);
      auVar19 = vpandq_avx512vl(auVar19,auVar29);
      auVar10 = vpaddw_avx512vl(auVar10,auVar19);
      auVar19 = vpsrlw_avx512vl(auVar30,2);
      auVar19 = vpandq_avx512vl(auVar19,auVar29);
      auVar11 = vpaddw_avx512vl(auVar11,auVar19);
      auVar19 = vpsrlw_avx512vl(auVar30,3);
      auVar19 = vpandq_avx512vl(auVar19,auVar29);
      auVar12 = vpaddw_avx512vl(auVar12,auVar19);
      auVar19 = vpsrlw_avx512vl(auVar30,4);
      auVar19 = vpandq_avx512vl(auVar19,auVar29);
      auVar13 = vpaddw_avx512vl(auVar13,auVar19);
      auVar19 = vpsrlw_avx512vl(auVar30,5);
      auVar19 = vpandq_avx512vl(auVar19,auVar29);
      auVar14 = vpaddw_avx512vl(auVar14,auVar19);
      auVar19 = vpsrlw_avx512vl(auVar30,6);
      auVar19 = vpandq_avx512vl(auVar19,auVar29);
      auVar15 = vpaddw_avx512vl(auVar15,auVar19);
      auVar19 = vpsrlw_avx512vl(auVar30,7);
      auVar19 = vpandq_avx512vl(auVar19,auVar29);
      auVar16 = vpaddw_avx512vl(auVar16,auVar19);
      auVar19 = vpsrlw_avx512vl(auVar30,8);
      auVar19 = vpandq_avx512vl(auVar19,auVar29);
      _auStack_88 = vpaddw_avx512vl(_auStack_88,auVar19);
      auVar19 = vpsrlw_avx512vl(auVar30,9);
      auVar19 = vpandq_avx512vl(auVar19,auVar29);
      register0x000008fc = vpaddw_avx512vl(unique0x100000a8,auVar19);
      auVar19 = vpsrlw_avx512vl(auVar30,10);
      auVar19 = vpandq_avx512vl(auVar19,auVar29);
      local_68 = vpaddw_avx512vl(local_68,auVar19);
      auVar19 = vpsrlw_avx512vl(auVar30,0xb);
      auVar19 = vpandq_avx512vl(auVar19,auVar29);
      local_58 = vpaddw_avx512vl(local_58,auVar19);
      auVar19 = vpsrlw_avx512vl(auVar30,0xc);
      auVar19 = vpandq_avx512vl(auVar19,auVar29);
      local_48 = vpaddw_avx512vl(local_48,auVar19);
      auVar19 = vpsrlw_avx512vl(auVar30,0xd);
      auVar19 = vpandq_avx512vl(auVar19,auVar29);
      local_38 = vpaddw_avx512vl(local_38,auVar19);
      auVar19 = vpsrlw_avx512vl(auVar30,0xe);
      auVar30 = vpsrlw_avx(auVar30,0xf);
      auVar19 = vpandq_avx512vl(auVar19,auVar29);
      local_18 = vpaddw_avx(local_18,auVar30);
      auVar30 = vpandq_avx512vl(auVar18,auVar20);
      auVar30 = vpternlogq_avx512vl(auVar30,auVar17,auVar27._0_16_,0xf8);
      local_28 = vpaddw_avx512vl(local_28,auVar19);
      auVar17 = vpxorq_avx512vl(auVar18,auVar20);
      auVar27 = ZEXT1664(auVar17);
    }
    local_f8 = vmovdqa64_avx512vl(auVar10);
    local_e8 = vmovdqa64_avx512vl(auVar11);
    local_d8 = vmovdqa64_avx512vl(auVar12);
    local_c8 = vmovdqa64_avx512vl(auVar13);
    local_b8 = vmovdqa64_avx512vl(auVar14);
    local_a8 = vmovdqa64_avx512vl(auVar15);
    local_98 = vmovdqa64_avx512vl(auVar16);
    for (lVar7 = 0; lVar7 != 0x100; lVar7 = lVar7 + 0x10) {
      auVar12 = vpand_avx(auVar30,auVar29);
      auVar12 = vpaddw_avx(auVar12,*(undefined1 (*) [16])(local_108 + lVar7));
      auVar30 = vpsrlw_avx(auVar30,1);
      *(undefined1 (*) [16])(local_108 + lVar7) = auVar12;
    }
    for (lVar7 = 0; lVar7 != 0x10; lVar7 = lVar7 + 1) {
      local_118._8_8_ = *(undefined8 *)(local_108 + lVar7 * 0x10 + 8);
      local_118._0_8_ = *(undefined8 *)(local_108 + lVar7 * 0x10);
      uVar6 = flags[lVar7];
      for (lVar9 = 0; lVar9 != 8; lVar9 = lVar9 + 1) {
        uVar6 = uVar6 + (uint)*(ushort *)(local_118 + lVar9 * 2) * 0x10;
      }
      flags[lVar7] = uVar6;
    }
  }
  local_118 = auVar32._0_16_;
  for (lVar7 = 0; lVar7 != 8; lVar7 = lVar7 + 1) {
    uVar1 = *(ushort *)(local_118 + lVar7 * 2);
    for (lVar9 = 0; lVar9 != 0x10; lVar9 = lVar9 + 1) {
      flags[lVar9] = flags[lVar9] + (uint)((uVar1 >> ((uint)lVar9 & 0x1f) & 1) != 0);
    }
  }
  local_118 = auVar31._0_16_;
  for (lVar7 = 0; lVar7 != 8; lVar7 = lVar7 + 1) {
    uVar1 = *(ushort *)(local_118 + lVar7 * 2);
    for (lVar9 = 0; lVar9 != 0x10; lVar9 = lVar9 + 1) {
      flags[lVar9] = flags[lVar9] + ((uint)(uVar1 >> ((uint)lVar9 & 0x1f)) * 2 & 2);
    }
  }
  local_118 = auVar28._0_16_;
  for (lVar7 = 0; lVar7 != 8; lVar7 = lVar7 + 1) {
    uVar1 = *(ushort *)(local_118 + lVar7 * 2);
    for (lVar9 = 0; lVar9 != 0x10; lVar9 = lVar9 + 1) {
      flags[lVar9] = flags[lVar9] + (uVar1 >> ((uint)lVar9 & 0x1f) & 1) * 4;
    }
  }
  local_118 = auVar27._0_16_;
  for (lVar7 = 0; lVar7 != 8; lVar7 = lVar7 + 1) {
    uVar1 = *(ushort *)(local_118 + lVar7 * 2);
    for (lVar9 = 0; lVar9 != 0x10; lVar9 = lVar9 + 1) {
      flags[lVar9] = flags[lVar9] + (uVar1 >> ((uint)lVar9 & 0x1f) & 1) * 8;
    }
  }
  return 0;
}

Assistant:

int pospopcnt_u16_sse_harley_seal(const uint16_t* array, uint32_t len, uint32_t* flags) {
    for (uint32_t i = len - (len % (16 * 8)); i < len; ++i) {
        for (int j = 0; j < 16; ++j) {
            flags[j] += ((array[i] & (1 << j)) >> j);
        }
    }

    const __m128i* data = (const __m128i*)array;
    size_t size = len / 8;
    __m128i v1  = _mm_setzero_si128();
    __m128i v2  = _mm_setzero_si128();
    __m128i v4  = _mm_setzero_si128();
    __m128i v8  = _mm_setzero_si128();
    __m128i v16 = _mm_setzero_si128();
    __m128i twosA, twosB, foursA, foursB, eightsA, eightsB;

    const uint64_t limit = size - size % 16;
    uint64_t i = 0;
    uint16_t buffer[8];
    __m128i counter[16];

    while (i < limit) {        
        for (size_t i = 0; i < 16; ++i) {
            counter[i] = _mm_setzero_si128();
        }

        size_t thislimit = limit;
        if (thislimit - i >= (1 << 16))
            thislimit = i + (1 << 16) - 1;

        for (/**/; i < thislimit; i += 16) {
#define U(pos) {                     \
    counter[pos] = _mm_add_epi16(counter[pos], _mm_and_si128(v16, _mm_set1_epi16(1))); \
    v16 = _mm_srli_epi16(v16, 1); \
}
            pospopcnt_csa_sse(&twosA,  &v1, _mm_loadu_si128(data + i +  0), _mm_loadu_si128(data + i +  1));
            pospopcnt_csa_sse(&twosB,  &v1, _mm_loadu_si128(data + i +  2), _mm_loadu_si128(data + i +  3));
            pospopcnt_csa_sse(&foursA, &v2, twosA, twosB);
            pospopcnt_csa_sse(&twosA,  &v1, _mm_loadu_si128(data + i +  4), _mm_loadu_si128(data + i +  5));
            pospopcnt_csa_sse(&twosB,  &v1, _mm_loadu_si128(data + i +  6), _mm_loadu_si128(data + i +  7));
            pospopcnt_csa_sse(&foursB, &v2, twosA, twosB);
            pospopcnt_csa_sse(&eightsA,&v4, foursA, foursB);
            pospopcnt_csa_sse(&twosA,  &v1, _mm_loadu_si128(data + i +  8),  _mm_loadu_si128(data + i +  9));
            pospopcnt_csa_sse(&twosB,  &v1, _mm_loadu_si128(data + i + 10),  _mm_loadu_si128(data + i + 11));
            pospopcnt_csa_sse(&foursA, &v2, twosA, twosB);
            pospopcnt_csa_sse(&twosA,  &v1, _mm_loadu_si128(data + i + 12),  _mm_loadu_si128(data + i + 13));
            pospopcnt_csa_sse(&twosB,  &v1, _mm_loadu_si128(data + i + 14),  _mm_loadu_si128(data + i + 15));
            pospopcnt_csa_sse(&foursB, &v2, twosA, twosB);
            pospopcnt_csa_sse(&eightsB,&v4, foursA, foursB);
            U(0) U(1) U(2) U(3) U(4) U(5) U(6) U(7) U(8) U(9) U(10) U(11) U(12) U(13) U(14) U(15) // Updates
            pospopcnt_csa_sse(&v16,    &v8, eightsA, eightsB);
#undef U
        }

        // update the counters after the last iteration
        for (size_t i = 0; i < 16; ++i) {
            counter[i] = _mm_add_epi16(counter[i], _mm_and_si128(v16, _mm_set1_epi16(1)));
            v16 = _mm_srli_epi16(v16, 1);
        }
        
        for (size_t i = 0; i < 16; ++i) {
            _mm_storeu_si128((__m128i*)buffer, counter[i]);
            for (size_t z = 0; z < 8; z++) {
                flags[i] += 16 * (uint32_t)buffer[z];
            }
        }
    }

    _mm_storeu_si128((__m128i*)buffer, v1);
    for (size_t i = 0; i < 8; ++i) {
        for (int j = 0; j < 16; ++j) {
            flags[j] += ((buffer[i] & (1 << j)) >> j);
        }
    }

    _mm_storeu_si128((__m128i*)buffer, v2);
    for (size_t i = 0; i < 8; ++i) {
        for (int j = 0; j < 16; ++j) {
            flags[j] += 2 * ((buffer[i] & (1 << j)) >> j);
        }
    }
    _mm_storeu_si128((__m128i*)buffer, v4);
    for (size_t i = 0; i < 8; ++i) {
        for (int j = 0; j < 16; ++j) {
            flags[j] += 4 * ((buffer[i] & (1 << j)) >> j);
        }
    }
    _mm_storeu_si128((__m128i*)buffer, v8);
    for (size_t i = 0; i < 8; ++i) {
        for (int j = 0; j < 16; ++j) {
            flags[j] += 8 * ((buffer[i] & (1 << j)) >> j);
        }
    }
    return 0;
}